

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O2

string_t __thiscall duckdb::IntToVarInt<int>(duckdb *this,Vector *result,int int_value)

{
  long lVar1;
  undefined4 in_register_00000014;
  idx_t len;
  idx_t extraout_RDX;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *blob_00;
  char **ppcVar6;
  __type_conflict8 _Var7;
  double dVar8;
  string_t blob;
  
  len = CONCAT44(in_register_00000014,int_value);
  iVar3 = (int)result;
  uVar2 = (ulong)result & 0xffffffff;
  if (iVar3 < 0) {
    uVar4 = -(long)iVar3;
  }
  else {
    uVar4 = uVar2;
    if (iVar3 == 0) {
      uVar5 = 1;
      uVar4 = 0;
      goto LAB_01788456;
    }
  }
  _Var7 = ::std::log2<unsigned_long>(uVar4 + 1);
  dVar8 = ceil(_Var7 * 0.125);
  uVar5 = (ulong)dVar8;
  len = extraout_RDX;
LAB_01788456:
  blob = StringVector::EmptyString((StringVector *)this,(Vector *)(ulong)((int)uVar5 + 3),len);
  blob_00 = blob.value._8_8_;
  if (blob.value._0_4_ < 0xd) {
    blob_00 = blob.value.pointer.prefix;
  }
  Varint::SetHeader(blob_00,uVar5 & 0xffffffff,SUB81(uVar2 >> 0x1f,0));
  lVar1 = (uVar5 & 0xffffffff) * 8;
  ppcVar6 = (char **)(blob_00 + 3);
  while( true ) {
    lVar1 = lVar1 + -8;
    if ((int)uVar5 < 1) break;
    *(byte *)ppcVar6 = (byte)(uVar4 >> ((byte)lVar1 & 0x3f)) ^ (char)(uVar2 >> 0x18) >> 7;
    uVar5 = (ulong)((int)uVar5 - 1);
    ppcVar6 = (char **)((long)ppcVar6 + 1);
  }
  string_t::Finalize(&blob);
  return (string_t)blob.value;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}